

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

int get_allocate_points(CHAR_DATA *ch)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = 0;
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    iVar3 = iVar3 + *(short *)((long)ch->race * 0x88 + 0x4f0f90 + lVar4 * 2) + -0xd;
  }
  iVar2 = strcmp(pc_race_table[ch->race].name,"human");
  iVar1 = iVar3 + 2;
  if (iVar2 != 0) {
    iVar1 = iVar3;
  }
  return iVar1;
}

Assistant:

int get_allocate_points(CHAR_DATA *ch)
{
	int allocate = 0, i;

	for (i = STAT_STR; i < MAX_STATS; i++)
	{
		allocate += (pc_race_table[ch->race].max_stats[i] - 13);
	}

	if (!strcmp(pc_race_table[ch->race].name, "human"))
		allocate += 2;

	return allocate;
}